

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopReportController.cpp
# Opt level: O0

LoopInfo *
anon_unknown.dwarf_433838::get_loop_info
          (LoopInfo *__return_storage_ptr__,CaliperMetadataAccessInterface *db,EntryList *rec)

{
  EntryList *pEVar1;
  bool bVar2;
  int iVar3;
  cali_id_t cVar4;
  cali_id_t cVar5;
  cali_variant_t cVar6;
  Variant VVar7;
  string local_138;
  undefined1 local_118 [8];
  Variant v_loop;
  cali_variant_t local_f8;
  reference local_e8;
  Entry *e;
  const_iterator __end1;
  const_iterator __begin1;
  EntryList *__range1;
  string local_c0 [32];
  Attribute local_a0;
  Attribute lcnt_a;
  string local_90 [32];
  Attribute local_70;
  Attribute iter_a;
  string local_60 [32];
  Attribute local_40;
  Attribute loop_a;
  allocator<char> local_22;
  undefined1 local_21;
  EntryList *local_20;
  EntryList *rec_local;
  CaliperMetadataAccessInterface *db_local;
  LoopInfo *ret;
  
  local_21 = 0;
  local_20 = rec;
  rec_local = (EntryList *)db;
  db_local = (CaliperMetadataAccessInterface *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_22);
  __return_storage_ptr__->iterations = 0;
  __return_storage_ptr__->count = 0;
  std::allocator<char>::~allocator(&local_22);
  pEVar1 = rec_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"loop",(allocator<char> *)((long)&iter_a.m_node + 7));
  local_40.m_node =
       (Node *)(*(code *)(((pEVar1->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>).
                           _M_impl.super__Vector_impl_data._M_start)->m_value).m_v.value)
                         (pEVar1,local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&iter_a.m_node + 7));
  pEVar1 = rec_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"max#sum#loop.iterations",(allocator<char> *)((long)&lcnt_a.m_node + 7));
  local_70.m_node =
       (Node *)(*(code *)(((pEVar1->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>).
                           _M_impl.super__Vector_impl_data._M_start)->m_value).m_v.value)
                         (pEVar1,local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&lcnt_a.m_node + 7));
  pEVar1 = rec_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"max#count",(allocator<char> *)((long)&__range1 + 7));
  local_a0.m_node =
       (Node *)(*(code *)(((pEVar1->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>).
                           _M_impl.super__Vector_impl_data._M_start)->m_value).m_v.value)
                         (pEVar1,local_c0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  pEVar1 = local_20;
  __end1 = std::vector<cali::Entry,_std::allocator<cali::Entry>_>::begin(local_20);
  e = (Entry *)std::vector<cali::Entry,_std::allocator<cali::Entry>_>::end(pEVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
                                *)&e);
    if (!bVar2) break;
    local_e8 = __gnu_cxx::
               __normal_iterator<const_cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
               ::operator*(&__end1);
    cVar4 = cali::Entry::attribute(local_e8);
    cVar5 = cali::Attribute::id(&local_70);
    if (cVar4 == cVar5) {
      cVar6 = (cali_variant_t)cali::Entry::value(local_e8);
      local_f8 = cVar6;
      iVar3 = cali::Variant::to_int((Variant *)&local_f8,(bool *)0x0);
      __return_storage_ptr__->iterations = iVar3;
    }
    else {
      cVar4 = cali::Entry::attribute(local_e8);
      cVar5 = cali::Attribute::id(&local_a0);
      if (cVar4 == cVar5) {
        VVar7 = cali::Entry::value(local_e8);
        v_loop.m_v.value.v_uint = VVar7.m_v.type_and_size;
        iVar3 = cali::Variant::to_int((Variant *)&v_loop.m_v.value,(bool *)0x0);
        __return_storage_ptr__->count = iVar3;
      }
      else {
        VVar7 = cali::Entry::value(local_e8,&local_40);
        v_loop.m_v.type_and_size = (uint64_t)VVar7.m_v.value;
        local_118 = (undefined1  [8])VVar7.m_v.type_and_size;
        bVar2 = cali::Variant::empty((Variant *)local_118);
        if (!bVar2) {
          cali::Variant::to_string_abi_cxx11_(&local_138,(Variant *)local_118);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_138);
          std::__cxx11::string::~string((string *)&local_138);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

LoopInfo get_loop_info(CaliperMetadataAccessInterface& db, const EntryList& rec)
{
    LoopInfo ret { "", 0, 0 };

    Attribute loop_a = db.get_attribute("loop");
    Attribute iter_a = db.get_attribute("max#sum#loop.iterations");
    Attribute lcnt_a = db.get_attribute("max#count");

    for (const Entry& e : rec) {
        if (e.attribute() == iter_a.id())
            ret.iterations = e.value().to_int();
        else if (e.attribute() == lcnt_a.id())
            ret.count = e.value().to_int();
        else {
            Variant v_loop = e.value(loop_a);
            if (!v_loop.empty())
                ret.name = v_loop.to_string();
        }
    }

    return ret;
}